

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

uint32 vorbis_find_page(stb_vorbis *f,uint32 *end,uint32 *last)

{
  uint *puVar1;
  uint8 uVar2;
  byte bVar3;
  uint loc;
  uint uVar4;
  uint32 unaff_EBP;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  uint8 header [27];
  uint8 local_68 [4];
  uint8 local_64;
  byte local_63;
  uint local_52;
  byte local_4e;
  uint *local_40;
  uint *local_38;
  
  local_40 = end;
  local_38 = last;
  do {
    bVar10 = false;
    uVar5 = 0;
    if (f->eof == 0) {
      uVar2 = get8(f);
      bVar10 = true;
      uVar5 = unaff_EBP;
      if (uVar2 == 'O') {
        loc = stb_vorbis_get_file_offset(f);
        iVar7 = 1;
        uVar5 = 0;
        if (loc - 0x19 <= f->stream_len) {
          lVar8 = 1;
          do {
            uVar2 = get8(f);
            if (uVar2 != ogg_page_header[lVar8]) goto LAB_00161a39;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          lVar8 = 4;
LAB_00161a39:
          iVar7 = 1;
          if (f->eof == 0) {
            if ((int)lVar8 == 4) {
              local_68[0] = ogg_page_header[0];
              local_68[1] = ogg_page_header[1];
              local_68[2] = ogg_page_header[2];
              local_68[3] = ogg_page_header[3];
              lVar8 = 4;
              do {
                uVar2 = get8(f);
                local_68[lVar8] = uVar2;
                uVar4 = local_52;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x1b);
              iVar7 = 1;
              if (f->eof == 0) {
                if (local_64 == '\0') {
                  local_52 = 0;
                  lVar8 = 0;
                  uVar6 = 0;
                  do {
                    uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)local_68[lVar8]];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 0x1b);
                  uVar9 = (uint)local_4e;
                  iVar7 = 0;
                  if (local_4e != 0) {
                    do {
                      bVar3 = get8(f);
                      uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)bVar3];
                      iVar7 = iVar7 + (uint)bVar3;
                      uVar9 = uVar9 - 1;
                    } while (uVar9 != 0);
                  }
                  if (iVar7 != 0) {
                    if (f->eof != 0) {
                      unaff_EBP = 0;
                      iVar7 = 1;
                      goto LAB_00161aac;
                    }
                    do {
                      bVar3 = get8(f);
                      uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)bVar3];
                      iVar7 = iVar7 + -1;
                    } while (iVar7 != 0);
                  }
                  puVar1 = local_40;
                  if (uVar6 == uVar4) {
                    if (local_40 != (uint *)0x0) {
                      uVar4 = stb_vorbis_get_file_offset(f);
                      *puVar1 = uVar4;
                    }
                    if (local_38 != (uint *)0x0) {
                      *local_38 = local_63 >> 2 & 1;
                    }
                    set_file_offset(f,loc - 1);
                    iVar7 = 1;
                    unaff_EBP = 1;
                  }
                  else {
                    iVar7 = 0;
                  }
                }
                else {
                  iVar7 = 0xd;
                }
              }
              else {
                unaff_EBP = 0;
              }
LAB_00161aac:
              if ((iVar7 != 0xd) && (uVar5 = unaff_EBP, iVar7 != 0)) goto LAB_00161ac2;
            }
            set_file_offset(f,loc);
            iVar7 = 0;
            uVar5 = unaff_EBP;
          }
        }
LAB_00161ac2:
        bVar10 = iVar7 == 0;
      }
    }
    unaff_EBP = uVar5;
    if (!bVar10) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static uint32 vorbis_find_page(stb_vorbis *f, uint32 *end, uint32 *last)
{
   for(;;) {
      int n;
      if (f->eof) return 0;
      n = get8(f);
      if (n == 0x4f) { // page header candidate
         unsigned int retry_loc = stb_vorbis_get_file_offset(f);
         int i;
         // check if we're off the end of a file_section stream
         if (retry_loc - 25 > f->stream_len)
            return 0;
         // check the rest of the header
         for (i=1; i < 4; ++i)
            if (get8(f) != ogg_page_header[i])
               break;
         if (f->eof) return 0;
         if (i == 4) {
            uint8 header[27];
            uint32 i, crc, goal, len;
            for (i=0; i < 4; ++i)
               header[i] = ogg_page_header[i];
            for (; i < 27; ++i)
               header[i] = get8(f);
            if (f->eof) return 0;
            if (header[4] != 0) goto invalid;
            goal = header[22] + (header[23] << 8) + (header[24]<<16) + ((uint32)header[25]<<24);
            for (i=22; i < 26; ++i)
               header[i] = 0;
            crc = 0;
            for (i=0; i < 27; ++i)
               crc = crc32_update(crc, header[i]);
            len = 0;
            for (i=0; i < header[26]; ++i) {
               int s = get8(f);
               crc = crc32_update(crc, s);
               len += s;
            }
            if (len && f->eof) return 0;
            for (i=0; i < len; ++i)
               crc = crc32_update(crc, get8(f));
            // finished parsing probable page
            if (crc == goal) {
               // we could now check that it's either got the last
               // page flag set, OR it's followed by the capture
               // pattern, but I guess TECHNICALLY you could have
               // a file with garbage between each ogg page and recover
               // from it automatically? So even though that paranoia
               // might decrease the chance of an invalid decode by
               // another 2^32, not worth it since it would hose those
               // invalid-but-useful files?
               if (end)
                  *end = stb_vorbis_get_file_offset(f);
               if (last) {
                  if (header[5] & 0x04)
                     *last = 1;
                  else
                     *last = 0;
               }
               set_file_offset(f, retry_loc-1);
               return 1;
            }
         }
        invalid:
         // not a valid page, so rewind and look for next one
         set_file_offset(f, retry_loc);
      }
   }
}